

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

double __thiscall
bgui::ImageAdapter<unsigned_char>::getIntensityOfPixel
          (ImageAdapter<unsigned_char> *this,long x,long y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  SVector<long,_2> p;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  
  dVar6 = this->vmin + -1.0;
  dVar7 = (this->super_ImageAdapterBase).scale;
  local_28 = (long)((double)x / dVar7);
  local_20 = (long)((double)y / dVar7);
  local_18 = 1;
  gmath::SMatrix<long,_2,_3>::operator*
            ((SMatrix<long,_2,_3> *)&local_38,(SVector<long,_3> *)&(this->super_ImageAdapterBase).R)
  ;
  iVar2 = this->image->depth;
  iVar1 = iVar2 + -1;
  iVar3 = (this->super_ImageAdapterBase).channel;
  iVar4 = iVar1;
  lVar5 = 0;
  if (iVar3 < iVar2) {
    iVar4 = iVar3;
    lVar5 = (long)iVar3;
  }
  if (iVar3 < 0) {
    lVar5 = 0;
    iVar4 = iVar1;
  }
  for (; lVar5 <= iVar4; lVar5 = lVar5 + 1) {
    dVar7 = (double)this->image->img[lVar5][local_30][local_38];
    if (dVar7 <= dVar6) {
      dVar7 = dVar6;
    }
    dVar6 = dVar7;
  }
  if (this->vmax < dVar6 || dVar6 < this->vmin) {
    dVar6 = INFINITY;
  }
  return dVar6;
}

Assistant:

double getIntensityOfPixel(long x, long y) const
    {
      double ret=vmin-1;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      int dmin=0;
      int dmax=image->getDepth()-1;

      if (channel >= 0 && channel < image->getDepth())
      {
        dmin=dmax=channel;
      }

      for (int d=dmin; d<=dmax; d++)
      {
        if (image->get(p[0], p[1], d) > ret)
        {
          ret=image->get(p[0], p[1], d);
        }
      }

      if (ret < vmin || ret > vmax)
      {
        ret=std::numeric_limits<double>::infinity();
      }

      return ret;
    }